

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall wabt::interp::Memory::Grow(Memory *this,u32 count)

{
  ulong uVar1;
  u32 uVar2;
  
  uVar1 = (this->type_).limits.max;
  if ((ulong)this->pages_ <= uVar1 - count && count <= uVar1) {
    uVar2 = this->pages_ + count;
    this->pages_ = uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->data_,(ulong)(uVar2 * 0x10000));
    return (Result)Ok;
  }
  return (Result)Error;
}

Assistant:

Result Memory::Grow(u32 count) {
  u32 new_pages;
  if (CanGrow(type_.limits, pages_, count, &new_pages)) {
    pages_ = new_pages;
    data_.resize(new_pages * WABT_PAGE_SIZE);
    return Result::Ok;
  }
  return Result::Error;
}